

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

void __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream
          (CopyingFileInputStream *this)

{
  bool bVar1;
  string_view str;
  LogMessage local_20;
  char *local_10;
  
  if (this->close_on_delete_ == true) {
    bVar1 = Close(this);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x5f);
      str._M_str = "close() failed: ";
      str._M_len = 0x10;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str);
      local_10 = strerror(this->errno_);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(&local_20,&local_10);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_20);
    }
  }
  return;
}

Assistant:

FileInputStream::CopyingFileInputStream::~CopyingFileInputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      ABSL_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}